

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_analysis.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::DominatorAnalysisBase::Dominates
          (DominatorAnalysisBase *this,Instruction *a,Instruction *b)

{
  bool bVar1;
  BasicBlock *A;
  BasicBlock *B;
  Instruction *pIVar2;
  byte bVar3;
  
  if (b == (Instruction *)0x0 || a == (Instruction *)0x0) {
    bVar3 = 0;
  }
  else {
    bVar3 = 1;
    if (a != b) {
      A = IRContext::get_instr_block(a->context_,a);
      B = IRContext::get_instr_block(b->context_,b);
      if (A != B) {
        bVar1 = DominatorTree::Dominates(&this->tree_,A,B);
        return bVar1;
      }
      pIVar2 = b;
      if ((this->tree_).postdominator_ != false) {
        pIVar2 = a;
        a = b;
      }
      if (a->opcode_ != OpLabel) {
        do {
          a = (a->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          bVar3 = a == (Instruction *)0x0 |
                  (a->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_;
          if (bVar3 != 0) break;
        } while (a != pIVar2);
        bVar3 = bVar3 ^ 1;
      }
    }
  }
  return (bool)bVar3;
}

Assistant:

bool DominatorAnalysisBase::Dominates(Instruction* a, Instruction* b) const {
  if (!a || !b) {
    return false;
  }

  if (a == b) {
    return true;
  }

  BasicBlock* bb_a = a->context()->get_instr_block(a);
  BasicBlock* bb_b = b->context()->get_instr_block(b);

  if (bb_a != bb_b) {
    return tree_.Dominates(bb_a, bb_b);
  }

  const Instruction* current = a;
  const Instruction* other = b;

  if (tree_.IsPostDominator()) {
    std::swap(current, other);
  }

  // We handle OpLabel instructions explicitly since they are not stored in the
  // instruction list.
  if (current->opcode() == spv::Op::OpLabel) {
    return true;
  }

  while ((current = current->NextNode())) {
    if (current == other) {
      return true;
    }
  }

  return false;
}